

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

tuple<int,_int,_int> __thiscall
anon_unknown.dwarf_10c8c6::preprocessor<baryonyx::raw_problem>::reduce
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  undefined4 uVar3;
  _Hash_node_base *p_Var4;
  _Head_base<0UL,_int,_false> _Var5;
  long in_RDX;
  ulong __code;
  long lVar6;
  ulong uVar7;
  tuple<int,_int,_int> tVar8;
  uint local_40;
  int local_3c;
  
  local_3c = *(int *)(in_RDX + 0x28);
  uVar1 = *(long *)(in_RDX + 0x18) - *(long *)(in_RDX + 0x10);
  if ((int)(uVar1 >> 3) == 0) {
    local_40 = 0xffffffff;
  }
  else {
    local_40 = 0xffffffff;
    lVar6 = 4;
    uVar7 = 0;
    do {
      __code = (ulong)*(int *)(*(long *)(in_RDX + 0x10) + lVar6);
      p_Var2 = std::
               _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&constraint->elements,
                          __code % (ulong)(constraint->elements).
                                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                          (key_type *)(*(long *)(in_RDX + 0x10) + lVar6),__code);
      p_Var4 = (_Hash_node_base *)0x0;
      if (p_Var2 != (__node_base_ptr)0x0) {
        p_Var4 = p_Var2->_M_nxt;
      }
      if (p_Var4 == (_Hash_node_base *)0x0) {
        if (local_40 != 0xffffffff) {
          (anonymous_namespace)::preprocessor<baryonyx::raw_problem>::reduce();
        }
        local_40 = (uint)uVar7;
      }
      else {
        local_3c = local_3c -
                   (uint)*(byte *)((long)&p_Var4[1]._M_nxt + 4) *
                   *(int *)(*(long *)(in_RDX + 0x10) + -4 + lVar6);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 8;
    } while ((uVar1 >> 3 & 0xffffffff) != uVar7);
  }
  uVar3 = 0xffffffff;
  _Var5._M_head_impl = -1;
  if (-1 < (int)local_40) {
    _Var5._M_head_impl = *(int *)(*(long *)(in_RDX + 0x10) + (ulong)local_40 * 8);
    uVar3 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 4 + (ulong)local_40 * 8);
  }
  *(int *)&this->ctx = local_3c;
  *(undefined4 *)((long)&this->ctx + 4) = uVar3;
  *(int *)&this->pb = _Var5._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var5._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar8.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

auto reduce(const bx::constraint& constraint) -> std::tuple<int, int, int>
    {
        int constraint_result{ constraint.value };
        int remaining_index{ -1 };
        int factor;
        int var_id;

        for (int i = 0, e = bx::length(constraint.elements); i != e; ++i) {

            // Searches if the variable is already affected and then use the
            // value to update the value of the constraint.

            auto it = vars.find(constraint.elements[i].variable_index);
            if (it == vars.end()) {
                bx_assert(remaining_index == -1);
                remaining_index = i;
            } else {
                constraint_result +=
                  -1 * (constraint.elements[i].factor * it->second);
            }
        }

        if (remaining_index >= 0) {
            factor = constraint.elements[remaining_index].factor;
            var_id = constraint.elements[remaining_index].variable_index;
        } else {
            factor = -1;
            var_id = -1;
        }

        return std::make_tuple(factor, var_id, constraint_result);
    }